

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O3

void __thiscall deqp::gls::TextureSamplerTest::render(TextureSamplerTest *this)

{
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined1 local_d8 [8];
  long *local_d0;
  void *local_c8;
  long local_c0 [2];
  int local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_60;
  VertexArrayPointer local_58;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x1680))((this->m_program->m_program).m_program);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x12d);
  iVar2 = (**(code **)(lVar5 + 0xb48))((this->m_program->m_program).m_program);
  if (iVar2 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"samplerLoc != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
               ,0x130);
  }
  else {
    iVar4 = (**(code **)(lVar5 + 0xb48))((this->m_program->m_program).m_program);
    if (iVar4 != -1) {
      (**(code **)(lVar5 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glClearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x136);
      (**(code **)(lVar5 + 0x188))(0x4000);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glClear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x139);
      (**(code **)(lVar5 + 0x14f0))(iVar2,0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUniform1i(samplerLoc, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x13c);
      (**(code **)(lVar5 + 0x14e0))(0x3f800000,iVar4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUniform1f(scaleLoc, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x13f);
      GVar1 = this->m_target;
      if (GVar1 == 0x8513) {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"a_position","");
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_a8,local_a0 + (long)local_a8);
        local_b0 = 0;
        local_88._0_4_ = local_d8._0_4_;
        local_80._M_p = (pointer)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_d0,(long)local_c8 + (long)local_d0);
        local_60 = local_b0;
        local_58.componentType = VTX_COMP_FLOAT;
        local_58.convert = VTX_COMP_CONVERT_NONE;
        local_58.numComponents = 4;
        local_58.numElements = 6;
        local_58.stride = 0;
        local_58.data = s_positionsCube;
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0._0_4_ = INDEXTYPE_LAST;
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
        (**(code **)(lVar5 + 0x14e0))(0x3e800000,iVar4);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x16f);
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0 = (long *)CONCAT44(local_d0._4_4_,INDEXTYPE_LAST);
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
      }
      else if (GVar1 == 0x806f) {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"a_position","");
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_a8,local_a0 + (long)local_a8);
        local_b0 = 0;
        local_88._0_4_ = local_d8._0_4_;
        local_80._M_p = (pointer)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_d0,(long)local_c8 + (long)local_d0);
        local_60 = local_b0;
        local_58.componentType = VTX_COMP_FLOAT;
        local_58.convert = VTX_COMP_CONVERT_NONE;
        local_58.numComponents = 3;
        local_58.numElements = 6;
        local_58.stride = 0;
        local_58.data = s_positions3D;
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0._0_4_ = INDEXTYPE_LAST;
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
        (**(code **)(lVar5 + 0x14e0))(0x3e800000,iVar4);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x15e);
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0 = (long *)CONCAT44(local_d0._4_4_,INDEXTYPE_LAST);
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
      }
      else {
        if (GVar1 != 0xde1) {
          return;
        }
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"a_position","");
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_a8,local_a0 + (long)local_a8);
        local_b0 = 0;
        local_88._0_4_ = local_d8._0_4_;
        local_80._M_p = (pointer)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_d0,(long)local_c8 + (long)local_d0);
        local_60 = local_b0;
        local_58.componentType = VTX_COMP_FLOAT;
        local_58.convert = VTX_COMP_CONVERT_NONE;
        local_58.numComponents = 2;
        local_58.numElements = 6;
        local_58.stride = 0;
        local_58.data = s_positions;
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0._0_4_ = INDEXTYPE_LAST;
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
        (**(code **)(lVar5 + 0x14e0))(0x3e800000,iVar4);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x14d);
        local_d8._0_4_ = PRIMITIVETYPE_TRIANGLES;
        local_d8._4_4_ = 6;
        local_d0 = (long *)CONCAT44(local_d0._4_4_,INDEXTYPE_LAST);
        local_c8 = (void *)0x0;
        glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                  (VertexArrayBinding *)local_88,(PrimitiveList *)local_d8,(DrawUtilCallback *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"scaleLoc != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
               ,0x133);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureSamplerTest::render (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLuint	samplerLoc	= (GLuint)-1;
	GLuint	scaleLoc	= (GLuint)-1;

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram(m_program->getProgram())");

	samplerLoc = gl.getUniformLocation(m_program->getProgram(), "u_sampler");
	TCU_CHECK(samplerLoc != (GLuint)-1);

	scaleLoc = gl.getUniformLocation(m_program->getProgram(), "u_posScale");
	TCU_CHECK(scaleLoc != (GLuint)-1);

	gl.clearColor(0.5f, 0.5f, 0.5f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor(0.5f, 0.5f, 0.5f, 1.0f)");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear(GL_COLOR_BUFFER_BIT)");

	gl.uniform1i(samplerLoc, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i(samplerLoc, 0)");

	gl.uniform1f(scaleLoc, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 1.0f)");

	switch (m_target)
	{
		case GL_TEXTURE_2D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 2, 6, 0, s_positions))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_3D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 3, 6, 0, s_positions3D))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_CUBE_MAP:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 4, 6, 0, s_positionsCube))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		default:
			DE_ASSERT(false);
	}
}